

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O3

void lm_trie_quant_train_prob
               (lm_trie_quant_t *quant,int order,uint32 counts,ngram_raw_t *raw_ngrams)

{
  float32 *values;
  long lVar1;
  long lVar2;
  
  values = (float32 *)
           __ckd_calloc__((ulong)counts,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x126);
  if (counts == 0) {
    lVar2 = 0;
  }
  else {
    lVar1 = 0;
    lVar2 = 0;
    do {
      values[lVar2] = *(float32 *)((long)&raw_ngrams->prob + lVar1);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while ((ulong)counts * 0x18 != lVar1);
  }
  make_bins(values,(uint32)lVar2,quant->tables[(long)order + -2][0].begin,
            (uint32)(1L << (quant->prob_bits & 0x3f)));
  ckd_free(values);
  return;
}

Assistant:

void
lm_trie_quant_train_prob(lm_trie_quant_t * quant, int order, uint32 counts,
                         ngram_raw_t * raw_ngrams)
{
    float32 *probs;
    uint32 prob_num;
    ngram_raw_t *raw_ngrams_end;

    probs = (float32 *) ckd_calloc(counts, sizeof(*probs));
    raw_ngrams_end = raw_ngrams + counts;

    for (prob_num = 0; raw_ngrams != raw_ngrams_end; raw_ngrams++) {
        probs[prob_num++] = raw_ngrams->prob;
    }

    make_bins(probs, prob_num, quant->tables[order - 2][0].begin,
              1ULL << quant->prob_bits);
    ckd_free(probs);
}